

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob~.c
# Opt level: O0

void calc_derivatives(double *dstate,double *state,t_params *params)

{
  double dVar1;
  double saturationinverse;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double satstate2;
  double satstate1;
  double satstate0;
  double satinv;
  double sat;
  double k;
  t_params *params_local;
  double *state_local;
  double *dstate_local;
  
  dVar1 = params->p_cutoff * 6.283180236816406;
  dVar6 = params->p_saturation;
  saturationinverse = 1.0 / dVar6;
  dVar2 = clip(*state,dVar6,saturationinverse);
  dVar3 = clip(state[1],dVar6,saturationinverse);
  dVar4 = clip(state[2],dVar6,saturationinverse);
  dVar5 = clip(-params->p_resonance * state[3] + params->p_input,dVar6,saturationinverse);
  *dstate = dVar1 * (dVar5 - dVar2);
  dstate[1] = dVar1 * (dVar2 - dVar3);
  dstate[2] = dVar1 * (dVar3 - dVar4);
  dVar6 = clip(state[3],dVar6,saturationinverse);
  dstate[3] = dVar1 * (dVar4 - dVar6);
  return;
}

Assistant:

static void calc_derivatives(FLOAT *dstate, FLOAT *state, t_params *params)
{
    FLOAT k = ((float)(2*3.14159)) * params->p_cutoff;
    FLOAT sat = params->p_saturation, satinv = 1./sat;
    FLOAT satstate0 = clip(state[0], sat, satinv);
    FLOAT satstate1 = clip(state[1], sat, satinv);
    FLOAT satstate2 = clip(state[2], sat, satinv);
    dstate[0] = k *
        (clip(params->p_input - params->p_resonance * state[3], sat, satinv)
            - satstate0);
    dstate[1] = k * (satstate0 - satstate1);
    dstate[2] = k * (satstate1 - satstate2);
    dstate[3] = k * (satstate2 - clip(state[3], sat, satinv));
}